

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O3

void test_iterate(void)

{
  _Bool _Var1;
  int iVar2;
  bitset_t *bitset;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar9 = 0;
  bitset = bitset_create();
  do {
    uVar10 = uVar9 >> 6;
    if ((uVar10 < bitset->arraysize) || (_Var1 = bitset_grow(bitset,uVar10 + 1), _Var1)) {
      bitset->array[uVar10] = bitset->array[uVar10] | 1L << ((byte)uVar9 & 0x3f);
    }
    uVar9 = uVar9 + 3;
  } while (uVar9 != 3000);
  sVar3 = bitset_count(bitset);
  _assert_true((ulong)(sVar3 == 1000),"bitset_count(b) == 1000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x14);
  iVar2 = compute_cardinality(bitset);
  _assert_true((ulong)(iVar2 == 1000),"compute_cardinality(b) == 1000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x15);
  uVar9 = bitset->arraysize;
  if (uVar9 == 0) {
    lVar8 = 0;
  }
  else {
    uVar10 = 0;
    lVar8 = 0;
    uVar7 = 0;
    do {
      uVar5 = bitset->array[uVar10] >> ((byte)uVar7 & 0x3f);
      if (uVar5 == 0) {
        lVar4 = uVar10 * -0x40;
        do {
          uVar10 = uVar10 + 1;
          if (uVar9 == uVar10) goto LAB_00102c8d;
          uVar7 = bitset->array[uVar10];
          lVar4 = lVar4 + -0x40;
        } while (uVar7 == 0);
        lVar6 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        lVar6 = lVar6 - lVar4;
      }
      else {
        lVar6 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        lVar6 = uVar7 + lVar6;
      }
      _assert_true((ulong)(lVar6 == lVar8),"i == k",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0x18);
      lVar8 = lVar8 + 3;
      uVar7 = lVar6 + 1;
      uVar10 = uVar7 >> 6;
      uVar9 = bitset->arraysize;
    } while (uVar10 < uVar9);
  }
LAB_00102c8d:
  _assert_true((ulong)(lVar8 == 3000),"k == 3000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x1b);
  bitset_free(bitset);
  return;
}

Assistant:

DEFINE_TEST(test_iterate) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(bitset_count(b) == 1000);
    assert_true(compute_cardinality(b) == 1000);
    size_t k = 0;
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        assert_true(i == k);
        k += 3;
    }
    assert_true(k == 3000);
    bitset_free(b);
}